

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

float nk_font_text_width(nk_handle handle,float height,char *text,int len)

{
  float fVar1;
  int iVar2;
  int iVar3;
  nk_font_glyph *pnVar4;
  nk_rune unicode;
  float local_34;
  nk_rune local_2c;
  
  if (handle.ptr == (void *)0x0) {
    __assert_fail("font",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x327e,"float nk_font_text_width(nk_handle, float, const char *, int)");
  }
  if (*(long *)((long)handle.ptr + 0x58) == 0) {
    __assert_fail("font->glyphs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x327f,"float nk_font_text_width(nk_handle, float, const char *, int)");
  }
  local_34 = 0.0;
  if (len != 0 && text != (char *)0x0) {
    fVar1 = *(float *)((long)handle.ptr + 0x30);
    iVar2 = nk_utf_decode(text,&local_2c,len);
    if (iVar2 <= len && iVar2 != 0) {
      local_34 = 0.0;
      while (local_2c != 0xfffd) {
        pnVar4 = nk_font_find_glyph((nk_font *)handle.ptr,local_2c);
        local_34 = local_34 + pnVar4->xadvance * (height / fVar1);
        iVar3 = nk_utf_decode(text + iVar2,&local_2c,len - iVar2);
        iVar2 = iVar2 + iVar3;
        if (len < iVar2) {
          return local_34;
        }
        if (iVar3 == 0) {
          return local_34;
        }
      }
    }
  }
  return local_34;
}

Assistant:

NK_INTERN float
nk_font_text_width(nk_handle handle, float height, const char *text, int len)
{
    nk_rune unicode;
    int text_len  = 0;
    float text_width = 0;
    int glyph_len = 0;
    float scale = 0;

    struct nk_font *font = (struct nk_font*)handle.ptr;
    NK_ASSERT(font);
    NK_ASSERT(font->glyphs);
    if (!font || !text || !len)
        return 0;

    scale = height/font->info.height;
    glyph_len = text_len = nk_utf_decode(text, &unicode, (int)len);
    if (!glyph_len) return 0;
    while (text_len <= (int)len && glyph_len) {
        const struct nk_font_glyph *g;
        if (unicode == NK_UTF_INVALID) break;

        /* query currently drawn glyph information */
        g = nk_font_find_glyph(font, unicode);
        text_width += g->xadvance * scale;

        /* offset next glyph */
        glyph_len = nk_utf_decode(text + text_len, &unicode, (int)len - text_len);
        text_len += glyph_len;
    }
    return text_width;
}